

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O0

Matrix * __thiscall Matrix::operator+=(Matrix *this,Matrix *m)

{
  bool bVar1;
  int local_1c;
  int i;
  Matrix *m_local;
  Matrix *this_local;
  
  bVar1 = bShapeEqual(this,m);
  if (bVar1) {
    for (local_1c = 0; local_1c < this->nData; local_1c = local_1c + 1) {
      this->pData[local_1c] = m->pData[local_1c] + this->pData[local_1c];
    }
  }
  return this;
}

Assistant:

Matrix &Matrix::operator+=(const Matrix&m)
{
	if( bShapeEqual(m) )
		for( int i=0; i<nData; i++ )
			pData[i] += m.pData[i];
	return *this;
}